

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O1

void If_ManImproveMark_rec(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  if ((*(uint *)pObj >> 8 & 1) != 0) {
    return;
  }
  if ((*(uint *)pObj & 0xf) != 4) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifReduce.c"
                  ,0xba,"void If_ManImproveMark_rec(If_Man_t *, If_Obj_t *, Vec_Ptr_t *)");
  }
  If_ManImproveMark_rec(p,pObj->pFanin0,vVisited);
  If_ManImproveMark_rec(p,pObj->pFanin1,vVisited);
  uVar1 = vVisited->nCap;
  if (vVisited->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_003b1b1e;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
      }
      vVisited->pArray = ppvVar2;
    }
    vVisited->nCap = iVar3;
  }
LAB_003b1b1e:
  iVar3 = vVisited->nSize;
  vVisited->nSize = iVar3 + 1;
  vVisited->pArray[iVar3] = pObj;
  pObj->field_0x1 = pObj->field_0x1 | 1;
  return;
}

Assistant:

void If_ManImproveMark_rec( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    if ( pObj->fMark )
        return;
    assert( If_ObjIsAnd(pObj) );
    If_ManImproveMark_rec( p, If_ObjFanin0(pObj), vVisited );
    If_ManImproveMark_rec( p, If_ObjFanin1(pObj), vVisited );
    Vec_PtrPush( vVisited, pObj );
    pObj->fMark = 1;
}